

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

qsizetype QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>_>
          ::size(type *p)

{
  return (long)(p->a).a.b.m_length + (long)(p->a).a.a.a.b.m_length + (((p->a).a.a.a.a)->d).size +
         (long)(p->b).m_length + 2;
}

Assistant:

static qsizetype size(const type &p)
    {
        return QConcatenableEx<A>::size(p.a) + QConcatenableEx<B>::size(p.b);
    }